

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O1

NFRule * __thiscall icu_63::NFRuleSet::findFractionRuleSetRule(NFRuleSet *this,double number)

{
  NFRule **ppNVar1;
  uint uVar2;
  long lVar3;
  int64_t iVar4;
  long lVar5;
  NFRule *pNVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double dVar16;
  ulong uVar11;
  
  ppNVar1 = (this->rules).fStuff;
  uVar15 = (*ppNVar1)->baseValue;
  uVar8 = (ulong)(this->rules).fCount;
  if (1 < uVar8) {
    uVar9 = 1;
    do {
      lVar5 = ppNVar1[uVar9]->baseValue;
      uVar13 = uVar15 & 1;
      if ((((uint)uVar15 | (uint)lVar5) & 1) == 0) {
        bVar7 = 0;
        lVar14 = lVar5;
        uVar11 = uVar15;
        do {
          uVar10 = (long)uVar11 >> 1;
          lVar3 = lVar14 >> 1;
          uVar12 = (uint)lVar14;
          uVar2 = (uint)uVar11;
          uVar13 = uVar11 & 2;
          bVar7 = bVar7 + 1;
          lVar14 = lVar3;
          uVar11 = uVar10;
        } while (((uVar12 | uVar2) & 2) == 0);
      }
      else {
        bVar7 = 0;
        lVar3 = lVar5;
        uVar10 = uVar15;
      }
      uVar11 = -lVar3;
      if (uVar13 == 0) {
        uVar11 = uVar10;
      }
      while (uVar11 != 0) {
        do {
          uVar13 = uVar11;
          uVar11 = (long)uVar13 >> 1;
        } while ((uVar13 & 1) == 0);
        lVar14 = -uVar13;
        if (0 < (long)uVar13) {
          uVar10 = uVar13;
          lVar14 = lVar3;
        }
        lVar3 = lVar14;
        uVar11 = uVar10 - lVar14;
      }
      uVar15 = ((long)uVar15 / (long)(uVar10 << (bVar7 & 0x3f))) * lVar5;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar8);
  }
  iVar4 = util64_fromDouble((double)(long)uVar15 * number + 0.5);
  dVar16 = uprv_maxMantissa_63();
  lVar5 = util64_fromDouble(dVar16);
  uVar12 = (this->rules).fCount;
  if ((ulong)uVar12 == 0) {
    uVar8 = 0;
  }
  else {
    uVar9 = 0;
    uVar8 = 0;
    do {
      lVar14 = ((this->rules).fStuff[uVar9]->baseValue * iVar4) % (long)uVar15;
      lVar3 = uVar15 - lVar14;
      if (lVar14 <= (long)(uVar15 - lVar14)) {
        lVar3 = lVar14;
      }
      if (lVar3 < lVar5) {
        if (lVar3 == 0) {
          uVar8 = uVar9 & 0xffffffff;
          break;
        }
        uVar8 = uVar9 & 0xffffffff;
        lVar5 = lVar3;
      }
      uVar9 = uVar9 + 1;
    } while (uVar12 != uVar9);
  }
  uVar2 = (int)uVar8 + 1;
  if ((uVar2 < uVar12) &&
     (ppNVar1 = (this->rules).fStuff, ppNVar1[uVar2]->baseValue == ppNVar1[uVar8]->baseValue)) {
    dVar16 = (double)ppNVar1[uVar8]->baseValue * number;
    if (2.0 <= dVar16) {
      uVar8 = (ulong)uVar2;
    }
    if (dVar16 < 0.5) {
      uVar8 = (ulong)uVar2;
    }
  }
  ppNVar1 = (this->rules).fStuff;
  if (ppNVar1 == (NFRule **)0x0) {
    pNVar6 = (NFRule *)0x0;
  }
  else {
    pNVar6 = ppNVar1[uVar8];
  }
  return pNVar6;
}

Assistant:

const NFRule*
NFRuleSet::findFractionRuleSetRule(double number) const
{
    // the obvious way to do this (multiply the value being formatted
    // by each rule's base value until you get an integral result)
    // doesn't work because of rounding error.  This method is more
    // accurate

    // find the least common multiple of the rules' base values
    // and multiply this by the number being formatted.  This is
    // all the precision we need, and we can do all of the rest
    // of the math using integer arithmetic
    int64_t leastCommonMultiple = rules[0]->getBaseValue();
    int64_t numerator;
    {
        for (uint32_t i = 1; i < rules.size(); ++i) {
            leastCommonMultiple = util_lcm(leastCommonMultiple, rules[i]->getBaseValue());
        }
        numerator = util64_fromDouble(number * (double)leastCommonMultiple + 0.5);
    }
    // for each rule, do the following...
    int64_t tempDifference;
    int64_t difference = util64_fromDouble(uprv_maxMantissa());
    int32_t winner = 0;
    for (uint32_t i = 0; i < rules.size(); ++i) {
        // "numerator" is the numerator of the fraction if the
        // denominator is the LCD.  The numerator if the rule's
        // base value is the denominator is "numerator" times the
        // base value divided bythe LCD.  Here we check to see if
        // that's an integer, and if not, how close it is to being
        // an integer.
        tempDifference = numerator * rules[i]->getBaseValue() % leastCommonMultiple;


        // normalize the result of the above calculation: we want
        // the numerator's distance from the CLOSEST multiple
        // of the LCD
        if (leastCommonMultiple - tempDifference < tempDifference) {
            tempDifference = leastCommonMultiple - tempDifference;
        }

        // if this is as close as we've come, keep track of how close
        // that is, and the line number of the rule that did it.  If
        // we've scored a direct hit, we don't have to look at any more
        // rules
        if (tempDifference < difference) {
            difference = tempDifference;
            winner = i;
            if (difference == 0) {
                break;
            }
        }
    }

    // if we have two successive rules that both have the winning base
    // value, then the first one (the one we found above) is used if
    // the numerator of the fraction is 1 and the second one is used if
    // the numerator of the fraction is anything else (this lets us
    // do things like "one third"/"two thirds" without haveing to define
    // a whole bunch of extra rule sets)
    if ((unsigned)(winner + 1) < rules.size() &&
        rules[winner + 1]->getBaseValue() == rules[winner]->getBaseValue()) {
        double n = ((double)rules[winner]->getBaseValue()) * number;
        if (n < 0.5 || n >= 2) {
            ++winner;
        }
    }

    // finally, return the winning rule
    return rules[winner];
}